

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamSummary.h
# Opt level: O2

bool __thiscall StreamSummary<4U>::Add_Data(StreamSummary<4U> *this,Data<4U> *data)

{
  StreamCounter *counter;
  StreamBucket *this_00;
  StreamCounter *pSVar1;
  iterator iVar2;
  mapped_type *ppSVar3;
  
  iVar2 = std::
          _Hashtable<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mp)._M_h,data);
  if (iVar2.
      super__Node_iterator_base<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_true>
      ._M_cur != (__node_type *)0x0) {
    ppSVar3 = std::__detail::
              _Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<Data<4U>,_std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_std::allocator<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>_>,_std::__detail::_Select1st,_std::equal_to<Data<4U>_>,_My_Hash<4U>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->mp,data);
    counter = *ppSVar3;
    this_00 = counter->parent;
    Node<Data<4U>_>::Delete(&counter->super_Node<Data<4U>_>);
    if (this_00->child == counter) {
      pSVar1 = (StreamCounter *)(counter->super_Node<Data<4U>_>).next;
      this_00->child = pSVar1;
      Add_Bucket(this,counter->parent,counter);
      if (pSVar1 == (StreamCounter *)0x0) {
        Node<int>::Delete(&this_00->super_Node<int>);
        operator_delete(this_00,0x20);
      }
    }
    else {
      Add_Bucket(this,counter->parent,counter);
    }
  }
  return iVar2.
         super__Node_iterator_base<std::pair<const_Data<4U>,_StreamSummary<4U>::StreamCounter_*>,_true>
         ._M_cur != (__node_type *)0x0;
}

Assistant:

bool Add_Data(const Data<DATA_LEN>& data) {
		if (mp.find(data) == mp.end()) return false;

		bool del = false;
		StreamCounter* temp = mp[data];
		StreamBucket* prev = temp->parent;
		temp->Delete();
		if (prev->child == temp) {
			prev->child = (StreamCounter*)temp->next;
			if (temp->next == NULL) del = true;
		}

		Add_Bucket(temp->parent, temp);

		if (del) {
			prev->Delete();
			delete prev;
		}

		return true;
	}